

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTable::selectRow(QAccessibleTable *this,int row)

{
  QAccessibleObject *pQVar1;
  char cVar2;
  SelectionBehavior SVar3;
  SelectionMode SVar4;
  int iVar5;
  QAbstractItemView *pQVar6;
  QAbstractItemModel *pQVar7;
  QAbstractItemView *pQVar8;
  QItemSelectionModel *pQVar9;
  bool bVar10;
  long in_FS_OFFSET;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  pQVar6 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar7 = QAbstractItemView::model(pQVar6);
  if (pQVar7 != (QAbstractItemModel *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    pQVar8 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject)
    ;
    pQVar9 = QAbstractItemView::selectionModel(pQVar8);
    if (pQVar9 != (QItemSelectionModel *)0x0) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QModelIndex *)&local_58,pQVar6);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = -0x55555556;
      iStack_74 = -0x55555556;
      uStack_70 = 0xaaaaaaaa;
      uStack_6c = 0xaaaaaaaa;
      (**(code **)(*(long *)pQVar7 + 0x60))(&local_78,pQVar7,row,0,(QModelIndex *)&local_58);
      bVar10 = false;
      if (((local_78 < 0) || (bVar10 = false, iStack_74 < 0)) || (local_68 == (undefined1 *)0x0))
      goto LAB_00531e5b;
      (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
      pQVar8 = (QAbstractItemView *)
               QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
      SVar3 = QAbstractItemView::selectionBehavior(pQVar8);
      if (SVar3 != SelectColumns) {
        (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
        pQVar8 = (QAbstractItemView *)
                 QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
        SVar4 = QAbstractItemView::selectionMode(pQVar8);
        if (SVar4 != NoSelection) {
          if (SVar4 == ContiguousSelection) {
            if (row != 0) {
              pQVar9 = QAbstractItemView::selectionModel(pQVar6);
              cVar2 = QItemSelectionModel::isRowSelected
                                ((int)pQVar9,(QModelIndex *)(ulong)(row - 1));
              if (cVar2 != '\0') goto LAB_00531f57;
            }
            pQVar9 = QAbstractItemView::selectionModel(pQVar6);
            cVar2 = QItemSelectionModel::isRowSelected((int)pQVar9,(QModelIndex *)(ulong)(row + 1));
            if (cVar2 == '\0') goto LAB_00531f4f;
          }
          else if (SVar4 == SingleSelection) {
            (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
            pQVar6 = (QAbstractItemView *)
                     QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
            SVar3 = QAbstractItemView::selectionBehavior(pQVar6);
            if (SVar3 != SelectRows) {
              iVar5 = (**(code **)(*(long *)this + 0x58))(this);
              if (1 < iVar5) goto LAB_00531e59;
            }
            (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
            pQVar6 = (QAbstractItemView *)
                     QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
LAB_00531f4f:
            QAbstractItemView::clearSelection(pQVar6);
          }
LAB_00531f57:
          (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
          pQVar6 = (QAbstractItemView *)
                   QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
          pQVar9 = QAbstractItemView::selectionModel(pQVar6);
          (**(code **)(*(long *)pQVar9 + 0x68))(pQVar9,&local_78,0x22);
          bVar10 = true;
          goto LAB_00531e5b;
        }
      }
    }
  }
LAB_00531e59:
  bVar10 = false;
LAB_00531e5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTable::selectRow(int row)
{
    QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel || !view()->selectionModel())
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(row, 0, rootIndex);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectColumns)
        return false;

    switch (view()->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if (view()->selectionBehavior() != QAbstractItemView::SelectRows && columnCount() > 1 )
            return false;
        view()->clearSelection();
        break;
    case QAbstractItemView::ContiguousSelection:
        if ((!row || !theView->selectionModel()->isRowSelected(row - 1, rootIndex))
            && !theView->selectionModel()->isRowSelected(row + 1, rootIndex)) {
            theView->clearSelection();
        }
        break;
    default:
        break;
    }

    view()->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return true;
}